

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cpp
# Opt level: O0

void __thiscall
NaPolynomialFunc::NaPolynomialFunc(NaPolynomialFunc *this,char *szOptions,NaVector *vInit)

{
  char *in_RSI;
  NaDynAr<double> *in_RDI;
  int i;
  NaReal fTest;
  char *szToken;
  char *szRest;
  char *szThis;
  uint uVar1;
  NaDynAr<double> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_4c;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_10;
  
  local_10 = in_RSI;
  NaExternFunc::NaExternFunc((NaExternFunc *)in_RDI);
  in_RDI->_vptr_NaDynAr = (_func_int **)&PTR_PrintLog_00105c50;
  NaDynAr<double>::NaDynAr(in_RDI + 1);
  local_30 = strdup(local_10);
  local_40 = strtok(local_30," ");
  while (local_40 != (char *)0x0) {
    strtod(local_40,&local_38);
    if (local_38 != local_40) {
      NaDynAr<double>::addl
                (in_RDI,(double *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    local_40 = strtok((char *)0x0," ");
  }
  free(local_30);
  NaPrintLog("polynomial coefficients:");
  local_4c = NaDynAr<double>::count(in_RDI + 1);
  while (local_4c = local_4c - 1, -1 < (int)local_4c) {
    uVar1 = local_4c;
    in_stack_ffffffffffffff90 =
         (NaDynAr<double> *)NaDynAr<double>::operator[](in_stack_ffffffffffffff90,local_4c);
    NaPrintLog(" k[%d]=%g",in_stack_ffffffffffffff90->_vptr_NaDynAr,(ulong)uVar1);
  }
  NaPrintLog("\n");
  return;
}

Assistant:

NaPolynomialFunc::NaPolynomialFunc (char* szOptions, NaVector& vInit)
{
    char	*szThis = strdup(szOptions), *szRest, *szToken;
    NaReal	fTest;

    for(szToken = strtok(szThis, " ");
	NULL != szToken;
	szToken = strtok(NULL, " ")) {
	// Check for proper floating point number
	fTest = strtod(szToken, &szRest);
	if(szRest == szToken)
	    continue;
	vfK.addl(fTest);
    }
    free(szThis);

    NaPrintLog("polynomial coefficients:");
    for(int i = vfK.count()-1; i >= 0; --i) {
	NaPrintLog(" k[%d]=%g", i, vfK[i]);
    }
    NaPrintLog("\n");
}